

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComputePipeline.cpp
# Opt level: O1

Ptr<ComputePipeline> __thiscall
myvk::ComputePipeline::Create
          (ComputePipeline *this,Ptr<PipelineLayout> *pipeline_layout,
          Ptr<ShaderModule> *shader_module,VkSpecializationInfo *p_specialization_info)

{
  VkDevice pVVar1;
  PFN_vkCreateComputePipelines p_Var2;
  element_type *peVar3;
  int iVar4;
  VkResult VVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  Ptr<ComputePipeline> PVar7;
  shared_ptr<myvk::ComputePipeline> ret;
  VkComputePipelineCreateInfo create_info;
  _func_int **local_d8;
  element_type *peStack_d0;
  VkPipelineShaderStageCreateInfo local_c8;
  VkComputePipelineCreateInfo local_98;
  
  std::__shared_ptr<myvk::ComputePipeline,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<myvk::ComputePipeline>>
            ((__shared_ptr<myvk::ComputePipeline,(__gnu_cxx::_Lock_policy)2> *)&local_d8,
             (allocator<myvk::ComputePipeline> *)&local_98);
  local_d8[3] = (_func_int *)
                (pipeline_layout->
                super___shared_ptr<myvk::PipelineLayout,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d8 + 4),
             &(pipeline_layout->super___shared_ptr<myvk::PipelineLayout,_(__gnu_cxx::_Lock_policy)2>
              )._M_refcount);
  local_98.pNext = (void *)0x0;
  local_98.basePipelineHandle = (VkPipeline)0x0;
  local_98.basePipelineIndex = 0;
  local_98._92_4_ = 0;
  local_98.stage.pSpecializationInfo = (VkSpecializationInfo *)0x0;
  local_98.stage.module = (VkShaderModule)0x0;
  local_98.stage.pName = (char *)0x0;
  local_98.stage.pNext = (void *)0x0;
  local_98.stage.flags = 0;
  local_98.stage.stage = 0;
  local_98.flags = 0;
  local_98._20_4_ = 0;
  local_98.stage.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  local_98.stage._4_4_ = 0;
  local_98.sType = VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO;
  local_98._4_4_ = 0;
  local_98.layout =
       ((pipeline_layout->super___shared_ptr<myvk::PipelineLayout,_(__gnu_cxx::_Lock_policy)2>).
       _M_ptr)->m_pipeline_layout;
  ShaderModule::GetPipelineShaderStageCreateInfo
            (&local_c8,
             (shader_module->super___shared_ptr<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr,VK_SHADER_STAGE_COMPUTE_BIT,p_specialization_info);
  p_Var2 = vkCreateComputePipelines;
  iVar4 = (*(((pipeline_layout->super___shared_ptr<myvk::PipelineLayout,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr)->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  pVVar1 = *(VkDevice *)(*(long *)CONCAT44(extraout_var,iVar4) + 0x268);
  iVar4 = (*(((pipeline_layout->super___shared_ptr<myvk::PipelineLayout,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr)->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  VVar5 = (*p_Var2)(pVVar1,*(VkPipelineCache *)(*(long *)CONCAT44(extraout_var_00,iVar4) + 0x270),1,
                    &local_98,(VkAllocationCallbacks *)0x0,(VkPipeline *)(local_d8 + 5));
  peVar3 = peStack_d0;
  if (VVar5 == VK_SUCCESS) {
    (this->super_PipelineBase).super_DeviceObjectBase.super_Base.
    super_enable_shared_from_this<myvk::Base>._M_weak_this.
    super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    peStack_d0 = (element_type *)0x0;
    (this->super_PipelineBase).super_DeviceObjectBase.super_Base._vptr_Base = local_d8;
    (this->super_PipelineBase).super_DeviceObjectBase.super_Base.
    super_enable_shared_from_this<myvk::Base>._M_weak_this.
    super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
    local_d8 = (_func_int **)0x0;
  }
  else {
    (this->super_PipelineBase).super_DeviceObjectBase.super_Base._vptr_Base = (_func_int **)0x0;
    (this->super_PipelineBase).super_DeviceObjectBase.super_Base.
    super_enable_shared_from_this<myvk::Base>._M_weak_this.
    super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  }
  _Var6._M_pi = extraout_RDX;
  if (peStack_d0 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_d0);
    _Var6._M_pi = extraout_RDX_00;
  }
  PVar7.super___shared_ptr<myvk::ComputePipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var6._M_pi;
  PVar7.super___shared_ptr<myvk::ComputePipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (Ptr<ComputePipeline>)
         PVar7.super___shared_ptr<myvk::ComputePipeline,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ptr<ComputePipeline> ComputePipeline::Create(const Ptr<PipelineLayout> &pipeline_layout,
                                             const Ptr<ShaderModule> &shader_module,
                                             VkSpecializationInfo *p_specialization_info) {
	std::shared_ptr<ComputePipeline> ret = std::make_shared<ComputePipeline>();
	ret->m_pipeline_layout_ptr = pipeline_layout;

	VkComputePipelineCreateInfo create_info = {};
	create_info.sType = VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO;
	create_info.layout = pipeline_layout->GetHandle();
	create_info.stage =
	    shader_module->GetPipelineShaderStageCreateInfo(VK_SHADER_STAGE_COMPUTE_BIT, p_specialization_info);

	if (vkCreateComputePipelines(pipeline_layout->GetDevicePtr()->GetHandle(),
	                             pipeline_layout->GetDevicePtr()->GetPipelineCacheHandle(), 1, &create_info, nullptr,
	                             &ret->m_pipeline) != VK_SUCCESS)
		return nullptr;
	return ret;
}